

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  bool bVar5;
  col_value cVar6;
  ulong uVar7;
  _Head_base<0UL,_int_*,_false> _Var8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  row_iterator prVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_000012c4 [12];
  undefined1 local_90 [20];
  float local_7c;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  col_value *local_58;
  ulong local_50;
  long local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  int *local_38;
  
  cVar6 = (col_value)(first->current)._M_current;
  local_68 = this + 8;
  fVar17 = kappa / (1.0 - kappa);
  local_7c = theta;
  local_60._M_head_impl = (col_value *)first;
  local_58 = (col_value *)last;
  do {
    if (cVar6 == *local_58) {
      return false;
    }
    if (*(int *)(this + 0x80) <= *(int *)((long)cVar6 + -4)) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar11 = (int)local_68;
    local_78 = (long)*(int *)((long)cVar6 + -4);
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar11);
    solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,local_7c);
    uVar12 = 0;
    for (_Var8._M_head_impl = (int *)local_90._8_8_; _Var8._M_head_impl != (int *)local_90._0_8_;
        _Var8._M_head_impl = _Var8._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,iVar11);
      lVar16 = *(long *)(this + 0x48);
      auVar20 = ZEXT816(0) << 0x40;
      while (local_38 != local_40._M_head_impl) {
        iVar2 = *local_38;
        local_38 = local_38 + 2;
        auVar19._0_4_ = (float)*(int *)(lVar16 + (long)iVar2 * 4);
        auVar19._4_12_ = in_register_000012c4;
        auVar20 = vfmadd231ss_fma(auVar20,auVar19,
                                  ZEXT416(*(uint *)(*(long *)(this + 0x68) + (long)iVar2 * 4)));
      }
      lVar9 = *(long *)(this + 0x50);
      lVar14 = uVar12 * 0xc;
      *(int *)(lVar9 + 4 + lVar14) = (int)uVar12;
      *(undefined4 *)(lVar9 + 8 + lVar14) = *(undefined4 *)(lVar16 + (long)*_Var8._M_head_impl * 4);
      fVar18 = quadratic_cost_type<float>::operator()
                         (*(quadratic_cost_type<float> **)(this + 0x70),*(int *)(local_90._8_8_ + 4)
                          ,x);
      uVar12 = uVar12 + 1;
      *(float *)(*(long *)(this + 0x50) + lVar14) = fVar18 - auVar20._0_4_;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>
              (*(rc_data **)(this + 0x50),*(rc_data **)(this + 0x50) + (uVar12 & 0xffffffff),
               *(random_engine **)this);
    local_70._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(local_78 * 0xc);
    lVar16 = *(long *)(this + 0x58);
    local_50 = uVar12;
    if (*(int *)(lVar16 + (long)local_70._M_t.
                                super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                .
                                super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                ._M_head_impl) < 1) {
      iVar11 = 0;
      uVar12 = 0xffffffffffffffff;
LAB_00148f62:
      bVar5 = iVar11 <= *(int *)(lVar16 + 4 +
                                (long)local_70._M_t.
                                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                      .
                                      super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                      ._M_head_impl);
    }
    else {
      lVar14 = -0x100000000;
      lVar15 = 0;
      local_48 = (long)((int)uVar12 + -2);
      lVar16 = *(long *)(this + 0x50);
      iVar11 = 0;
      lVar9 = -1;
      do {
        uVar4 = local_90._8_8_;
        iVar11 = iVar11 + *(int *)(lVar16 + 8 + lVar15);
        lVar14 = lVar14 + 0x100000000;
        iVar2 = *(int *)(lVar16 + 4 + lVar15);
        iVar3 = *(int *)(*(long *)(this + 0x58) +
                        (long)local_70._M_t.
                              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                              .
                              super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                              ._M_head_impl);
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_90._8_8_ + (long)iVar2 * 8))->column);
        lVar16 = *(long *)(this + 0x50);
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(lVar16 + lVar15) * 0.5)),
                                  ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) +
                  (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4) =
             auVar20._0_4_ +
             *(float *)(*(long *)(this + 0x68) +
                       (long)((row_iterator)(uVar4 + (long)iVar2 * 8))->value * 4);
        if (iVar3 <= iVar11) break;
        lVar15 = lVar15 + 0xc;
        bVar5 = lVar9 < local_48;
        lVar9 = lVar9 + 1;
      } while (bVar5);
      lVar16 = *(long *)(this + 0x58);
      uVar12 = lVar14 >> 0x20;
      if (*(int *)(lVar16 + (long)local_70._M_t.
                                  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                  .
                                  super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                  ._M_head_impl) <= iVar11) goto LAB_00148f62;
      bVar5 = false;
    }
    uVar7 = (ulong)(int)local_50;
    lVar16 = uVar12 * 0xc;
    uVar10 = uVar12;
    while( true ) {
      uVar10 = uVar10 + 1;
      uVar12 = uVar12 + 1;
      if ((uVar7 <= uVar12) || (!bVar5)) break;
      lVar9 = *(long *)(this + 0x50);
      iVar11 = iVar11 + *(int *)(lVar9 + 0x14 + lVar16);
      if (iVar11 < *(int *)(*(long *)(this + 0x58) +
                           (long)local_70._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                                 ._M_head_impl)) {
        prVar13 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar9 + 0x10 + lVar16) * 8);
LAB_00149025:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar13->column);
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar16) *
                                                0.5)),ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar13->value * 4) =
             *(float *)(*(long *)(this + 0x68) + (long)prVar13->value * 4) - auVar20._0_4_;
        bVar5 = false;
      }
      else {
        prVar13 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar9 + 0x10 + lVar16) * 8);
        if ((*(int *)(*(long *)(this + 0x58) +
                      (long)local_70._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                            ._M_head_impl + 4) < iVar11) ||
           (bVar5 = stop_iterating<baryonyx::itm::maximize_tag,float>
                              (*(float *)(lVar9 + 0xc + lVar16),*(random_engine **)this), !bVar5))
        goto LAB_00149025;
        bit_array_impl::set(&x->super_bit_array_impl,prVar13->column);
        auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)(*(long *)(this + 0x50) + 0xc + lVar16) *
                                                0.5)),ZEXT416((uint)fVar17),ZEXT416((uint)delta));
        *(float *)(*(long *)(this + 0x68) + (long)prVar13->value * 4) =
             auVar20._0_4_ + *(float *)(*(long *)(this + 0x68) + (long)prVar13->value * 4);
        bVar5 = true;
      }
      lVar16 = lVar16 + 0xc;
    }
    while (uVar4 = local_90._8_8_, uVar10 < uVar7) {
      iVar11 = *(int *)(*(long *)(this + 0x50) + 0x10 + lVar16);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_90._8_8_ + (long)iVar11 * 8))->column);
      uVar10 = uVar10 + 1;
      pfVar1 = (float *)(*(long *)(this + 0x50) + 0xc + lVar16);
      lVar16 = lVar16 + 0xc;
      auVar20 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar17),
                                ZEXT416((uint)delta));
      *(float *)(*(long *)(this + 0x68) +
                (long)((row_iterator)(uVar4 + (long)iVar11 * 8))->value * 4) =
           *(float *)(*(long *)(this + 0x68) +
                     (long)((row_iterator)(uVar4 + (long)iVar11 * 8))->value * 4) - auVar20._0_4_;
    }
    bVar5 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                        *)this,(int)local_78,x);
    if (!bVar5) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    cVar6 = (col_value)((long)*local_60._M_head_impl + -4);
    *local_60._M_head_impl = cVar6;
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }